

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBranchAndBound.h
# Opt level: O0

double __thiscall
BGIP_SolverBranchAndBound<JointPolicyPureVectorForClusteredBG>::Solve
          (BGIP_SolverBranchAndBound<JointPolicyPureVectorForClusteredBG> *this)

{
  ostream *poVar1;
  BGIP_BnB_Node *this_00;
  type pBVar2;
  ulong uVar3;
  ulong uVar4;
  undefined8 *in_RDI;
  double dVar5;
  BGIP_SolverBranchAndBound<JointPolicyPureVectorForClusteredBG> *in_stack_00000050;
  Index jt_bgI;
  BGIP_BnB_NodePtr root;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_000000f8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_000003c8;
  BGIP_SolverBranchAndBound<JointPolicyPureVectorForClusteredBG> *in_stack_000003d0;
  size_type in_stack_ffffffffffffff08;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff10;
  shared_ptr<BGIP_BnB_Node> *in_stack_ffffffffffffff18;
  shared_ptr<BGIP_BnB_Node> *in_stack_ffffffffffffff20;
  value_type *in_stack_ffffffffffffff28;
  shared_ptr<BGIP_BnB_Node> *in_stack_ffffffffffffff30;
  string local_80 [36];
  uint local_5c;
  shared_count in_stack_ffffffffffffffc0;
  string local_28 [40];
  
  *(undefined1 *)(in_RDI + 0x24) = 1;
  (**(code **)*in_RDI)();
  if (0 < *(int *)(in_RDI + 0x22)) {
    poVar1 = std::operator<<((ostream *)&std::cout,"BGIP_SolverBranchAndBound::Solve() called.");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  ComputeCompleteInformationValues
            ((BGIP_SolverBranchAndBound<JointPolicyPureVectorForClusteredBG> *)
             in_stack_ffffffffffffffc0.pi_);
  ReOrderJointTypes(in_stack_000003d0,in_stack_000003c8);
  if (0 < *(int *)(in_RDI + 0x22)) {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "BGIP_SolverBranchAndBound Resulting order of joint types: ");
    PrintTools::SoftPrintVector<unsigned_int>(in_stack_000000f8);
    poVar1 = std::operator<<(poVar1,local_28);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_28);
  }
  boost::shared_ptr<BGIP_BnB_Node>::shared_ptr((shared_ptr<BGIP_BnB_Node> *)0x153429);
  this_00 = (BGIP_BnB_Node *)operator_new(0x40);
  pBVar2 = boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::operator->
                     ((shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)(in_RDI + 0x25));
  uVar3 = (**(code **)(*(long *)pBVar2 + 0x18))();
  BGIP_BnB_Node::BGIP_BnB_Node(this_00,uVar3);
  boost::shared_ptr<BGIP_BnB_Node>::shared_ptr<BGIP_BnB_Node>
            (in_stack_ffffffffffffff30,(BGIP_BnB_Node *)in_stack_ffffffffffffff28);
  boost::shared_ptr<BGIP_BnB_Node>::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  boost::shared_ptr<BGIP_BnB_Node>::~shared_ptr((shared_ptr<BGIP_BnB_Node> *)0x1534a5);
  local_5c = 0;
  while( true ) {
    uVar3 = (ulong)local_5c;
    boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::operator->
              ((shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)(in_RDI + 0x25));
    uVar4 = BayesianGameBase::GetNrJointTypes();
    if (uVar3 == uVar4) break;
    boost::shared_ptr<BGIP_BnB_Node>::operator->
              ((shared_ptr<BGIP_BnB_Node> *)&stack0xffffffffffffffb8);
    in_stack_ffffffffffffff30 =
         (shared_ptr<BGIP_BnB_Node> *)
         std::vector<double,_std::allocator<double>_>::at
                   (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    BGIP_BnB_Node::UpdateH((double)in_stack_ffffffffffffff30->px);
    local_5c = local_5c + 1;
  }
  std::
  priority_queue<boost::shared_ptr<BGIP_BnB_Node>,_std::vector<boost::shared_ptr<BGIP_BnB_Node>,_std::allocator<boost::shared_ptr<BGIP_BnB_Node>_>_>,_std::less<boost::shared_ptr<BGIP_BnB_Node>_>_>
  ::push((priority_queue<boost::shared_ptr<BGIP_BnB_Node>,_std::vector<boost::shared_ptr<BGIP_BnB_Node>,_std::allocator<boost::shared_ptr<BGIP_BnB_Node>_>_>,_std::less<boost::shared_ptr<BGIP_BnB_Node>_>_>
          *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  if (3 < *(int *)(in_RDI + 0x22)) {
    poVar1 = std::operator<<((ostream *)&std::cout,"BGIP_SolverBranchAndBound ");
    boost::shared_ptr<BGIP_BnB_Node>::operator->
              ((shared_ptr<BGIP_BnB_Node> *)&stack0xffffffffffffffb8);
    BGIP_BnB_Node::SoftPrint_abi_cxx11_();
    poVar1 = std::operator<<(poVar1,local_80);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_80);
  }
  dVar5 = ReSolve(in_stack_00000050);
  boost::shared_ptr<BGIP_BnB_Node>::~shared_ptr((shared_ptr<BGIP_BnB_Node> *)0x153672);
  return dVar5;
}

Assistant:

double Solve()
    {
        _m_solved=true;
        this->InitDeadline();
        if(_m_verbosity>=1)
            std::cout << "BGIP_SolverBranchAndBound::Solve() called."<<std::endl;
        // Compute upper bound heuristic values
        ComputeCompleteInformationValues();
        
        // Reorder the joint types
        ReOrderJointTypes(_m_jtIndexMapping); 

        if(_m_verbosity>=1)
            std::cout
                << "BGIP_SolverBranchAndBound Resulting order of joint types: "
                << SoftPrintVector(_m_jtIndexMapping) << std::endl;

        // Initialize root node
        BGIP_BnB_NodePtr root;
        // If we want to update the joint type index mapping during the
        // search, we have to maintain it for each node. Otherwise we can
        // just use the copy in this class.
#if DYNAMIC_JT_INDEX_MAPPING
        if(_m_reComputeJTIndexMapping)
            root = new BGIP_BnB_Node(_m_bgip, _m_maxDepth,
                                     _m_jtIndexMapping);
        else
#endif
            root = BGIP_BnB_NodePtr(new BGIP_BnB_Node(_m_bgip->GetNrAgents()));
        // G is initialized to 0,
        // H is also initialized to 0, so we now *add* the contributions for each joint type
        for(Index jt_bgI=0;jt_bgI!=_m_bgip->GetNrJointTypes();++jt_bgI)
            root->UpdateH(_m_completeInformationValues.at(jt_bgI));

        // push the root node on the queue of open nodes
        _m_openQueue->push(root);

        if(_m_verbosity>3)
            std::cout << "BGIP_SolverBranchAndBound "
                      << root->SoftPrint() << std::endl;

        return(ReSolve());
    }